

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 *size_arg)

{
  ImGuiWindow *this;
  float h;
  float s;
  float v;
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  undefined7 extraout_var;
  ImVec2 *p_max;
  size_t data_size;
  ImGuiID IVar5;
  ImVec4 *pIVar6;
  ImDrawList *pIVar7;
  char *type;
  ImDrawFlags flags_00;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 grid_off;
  ImVec2 IVar13;
  bool hovered;
  bool held;
  ImVec4 col_rgb;
  ImVec4 col_source;
  bool local_111;
  ImGuiID local_110;
  bool local_109;
  ImVec4 local_108;
  ImRect local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  ImVec2 local_d8;
  ImVec2 IStack_d0;
  ImVec4 *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  float fStack_9c;
  char *local_98;
  undefined8 local_90;
  ImVec4 local_88;
  ImVec2 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_c0 = col;
  local_110 = ImGuiWindow::GetID(this,desc_id,(char *)0x0);
  fStack_b0 = GetFrameHeight();
  local_f8.Min = (this->DC).CursorPos;
  fVar10 = (*size_arg).x;
  fVar11 = (*size_arg).y;
  uVar8 = -(uint)(fVar10 == 0.0);
  uVar9 = -(uint)(fVar11 == 0.0);
  local_b8 = (float)(~uVar8 & (uint)fVar10 | (uint)fStack_b0 & uVar8);
  local_e8 = (float)(~uVar9 & (uint)fVar11 | (uint)fStack_b0 & uVar9);
  IVar13 = (this->DC).CursorPos;
  fVar11 = IVar13.x + local_b8;
  fVar12 = IVar13.y + local_e8;
  local_f8.Max.y = fVar12;
  local_f8.Max.x = fVar11;
  fVar10 = 0.0;
  if (fStack_b0 <= local_e8) {
    fVar10 = (pIVar2->Style).FramePadding.y;
  }
  local_108.y = fVar12 - local_f8.Min.y;
  local_108.x = fVar11 - local_f8.Min.x;
  fStack_e4 = local_e8;
  fStack_e0 = local_e8;
  fStack_dc = local_e8;
  fStack_b4 = local_e8;
  fStack_ac = fStack_b0;
  ItemSize((ImVec2 *)&local_108,fVar10);
  IVar5 = local_110;
  local_90 = 0;
  bVar3 = ItemAdd(&local_f8,local_110,(ImRect *)0x0,0);
  if (!bVar3) goto LAB_00182af5;
  local_98 = desc_id;
  bVar3 = ButtonBehavior(&local_f8,IVar5,&local_111,&local_109,0);
  uVar8 = flags & 0xfff9ffff;
  if ((flags & 2U) == 0) {
    uVar8 = flags;
  }
  local_90 = CONCAT71(extraout_var,bVar3);
  h = local_c0->x;
  s = local_c0->y;
  v = local_c0->z;
  fVar1 = local_c0->w;
  local_108.x = h;
  local_108.y = s;
  local_108.z = v;
  local_108.w = fVar1;
  if ((uVar8 >> 0x1c & 1) != 0) {
    ColorConvertHSVtoRGB(h,s,v,&local_108.x,&local_108.y,&local_108.z);
  }
  local_88.x = local_108.x;
  local_88.y = local_108.y;
  local_88.z = local_108.z;
  fVar10 = local_b8;
  if (local_e8 <= local_b8) {
    fVar10 = local_e8;
  }
  fVar10 = fVar10 / 2.99;
  local_88.w = 1.0;
  local_e8 = (pIVar2->Style).FrameRounding;
  local_d8 = local_f8.Min;
  IStack_d0 = local_f8.Max;
  uVar9 = 0;
  if ((uVar8 >> 10 & 1) == 0) {
    local_d8.x = local_f8.Min.x;
    local_d8.y = local_f8.Min.y;
    IStack_d0.x = local_f8.Max.x;
    IStack_d0.y = local_f8.Max.y;
    local_d8.y = local_d8.y + 0.75;
    local_d8.x = local_d8.x + 0.75;
    IStack_d0.y = IStack_d0.y + -0.75;
    IStack_d0.x = IStack_d0.x + -0.75;
    uVar9 = 0xbf400000;
  }
  if (fVar10 * 0.5 <= local_e8) {
    local_e8 = fVar10 * 0.5;
  }
  if (((uVar8 >> 0x12 & 1) == 0) || (1.0 <= local_108.w)) {
    pIVar6 = &local_108;
    if ((uVar8 >> 0x11 & 1) == 0) {
      pIVar6 = &local_88;
    }
    local_a8.x = pIVar6->x;
    local_a8.y = pIVar6->y;
    uStack_a0._0_4_ = pIVar6->z;
    uStack_a0._4_4_ = pIVar6->w;
    pIVar7 = this->DrawList;
    if (1.0 <= uStack_a0._4_4_) {
      p_max = &IStack_d0;
      IVar4 = GetColorU32((ImVec4 *)&local_a8);
      flags_00 = 0;
      goto LAB_0018299f;
    }
    local_68._8_8_ = 0;
    local_68._0_4_ = local_d8.x;
    local_68._4_4_ = local_d8.y;
    local_78 = IStack_d0;
    uStack_70 = 0;
    local_58 = ZEXT416(uVar9);
    local_b8 = fVar10;
    IVar4 = GetColorU32((ImVec4 *)&local_a8);
    IVar13.y = (float)local_58._0_4_;
    IVar13.x = (float)local_58._0_4_;
    RenderColorRectWithAlphaCheckerboard
              (pIVar7,(ImVec2)local_68._0_8_,local_78,IVar4,local_b8,IVar13,local_e8,0);
  }
  else {
    local_58 = ZEXT416(uVar9);
    local_68 = ZEXT416((uint)(float)(int)((IStack_d0.x + local_d8.x) * 0.5 + 0.5));
    pIVar7 = this->DrawList;
    local_78 = IStack_d0;
    uStack_70 = 0;
    local_48.y = local_d8.y;
    local_48.x = local_d8.x + fVar10;
    uStack_40 = 0;
    local_b8 = fVar10;
    IVar4 = GetColorU32(&local_108);
    grid_off.x = (float)local_58._0_4_ - local_b8;
    grid_off.y = (float)local_58._0_4_;
    RenderColorRectWithAlphaCheckerboard
              (pIVar7,local_48,local_78,IVar4,local_b8,grid_off,local_e8,0xa0);
    pIVar7 = this->DrawList;
    p_max = &local_a8;
    local_a8.y = IStack_d0.y;
    local_a8.x = (float)local_68._0_4_;
    IVar4 = GetColorU32(&local_88);
    flags_00 = 0x50;
LAB_0018299f:
    ImDrawList::AddRectFilled(pIVar7,&local_d8,p_max,IVar4,local_e8,flags_00);
  }
  IVar5 = local_110;
  RenderNavHighlight(&local_f8,local_110,1);
  if ((uVar8 >> 10 & 1) == 0) {
    if ((pIVar2->Style).FrameBorderSize <= 0.0) {
      pIVar7 = this->DrawList;
      IVar4 = GetColorU32(7,1.0);
      IVar5 = local_110;
      ImDrawList::AddRect(pIVar7,&local_f8.Min,&local_f8.Max,IVar4,local_e8,0,1.0);
    }
    else {
      RenderFrameBorder(local_f8.Min,local_f8.Max,local_e8);
    }
  }
  if ((((uVar8 >> 9 & 1) == 0) && (pIVar2->ActiveId == IVar5)) &&
     (bVar3 = BeginDragDropSource(0), bVar3)) {
    if ((uVar8 & 2) == 0) {
      type = "_COL4F";
      data_size = 0x10;
    }
    else {
      type = "_COL3F";
      data_size = 0xc;
    }
    SetDragDropPayload(type,&local_108,data_size,2);
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    ColorButton(local_98,local_c0,uVar8,&local_a8);
    SameLine(0.0,-1.0);
    TextEx("Color",(char *)0x0,0);
    EndDragDropSource();
  }
  if (((uVar8 & 0x40) == 0) && (local_111 == true)) {
    ColorTooltip(local_98,&local_c0->x,uVar8 & 0x18060002);
  }
LAB_00182af5:
  return (bool)(char)local_90;
}

Assistant:

bool ImGui::ColorButton(const char* desc_id, const ImVec4& col, ImGuiColorEditFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(desc_id);
    const float default_size = GetFrameHeight();
    const ImVec2 size(size_arg.x == 0.0f ? default_size : size_arg.x, size_arg.y == 0.0f ? default_size : size_arg.y);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    if (flags & ImGuiColorEditFlags_NoAlpha)
        flags &= ~(ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf);

    ImVec4 col_rgb = col;
    if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(col_rgb.x, col_rgb.y, col_rgb.z, col_rgb.x, col_rgb.y, col_rgb.z);

    ImVec4 col_rgb_without_alpha(col_rgb.x, col_rgb.y, col_rgb.z, 1.0f);
    float grid_step = ImMin(size.x, size.y) / 2.99f;
    float rounding = ImMin(g.Style.FrameRounding, grid_step * 0.5f);
    ImRect bb_inner = bb;
    float off = 0.0f;
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        off = -0.75f; // The border (using Col_FrameBg) tends to look off when color is near-opaque and rounding is enabled. This offset seemed like a good middle ground to reduce those artifacts.
        bb_inner.Expand(off);
    }
    if ((flags & ImGuiColorEditFlags_AlphaPreviewHalf) && col_rgb.w < 1.0f)
    {
        float mid_x = IM_ROUND((bb_inner.Min.x + bb_inner.Max.x) * 0.5f);
        RenderColorRectWithAlphaCheckerboard(window->DrawList, ImVec2(bb_inner.Min.x + grid_step, bb_inner.Min.y), bb_inner.Max, GetColorU32(col_rgb), grid_step, ImVec2(-grid_step + off, off), rounding, ImDrawFlags_RoundCornersRight);
        window->DrawList->AddRectFilled(bb_inner.Min, ImVec2(mid_x, bb_inner.Max.y), GetColorU32(col_rgb_without_alpha), rounding, ImDrawFlags_RoundCornersLeft);
    }
    else
    {
        // Because GetColorU32() multiplies by the global style Alpha and we don't want to display a checkerboard if the source code had no alpha
        ImVec4 col_source = (flags & ImGuiColorEditFlags_AlphaPreview) ? col_rgb : col_rgb_without_alpha;
        if (col_source.w < 1.0f)
            RenderColorRectWithAlphaCheckerboard(window->DrawList, bb_inner.Min, bb_inner.Max, GetColorU32(col_source), grid_step, ImVec2(off, off), rounding);
        else
            window->DrawList->AddRectFilled(bb_inner.Min, bb_inner.Max, GetColorU32(col_source), rounding);
    }
    RenderNavHighlight(bb, id);
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        if (g.Style.FrameBorderSize > 0.0f)
            RenderFrameBorder(bb.Min, bb.Max, rounding);
        else
            window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), rounding); // Color button are often in need of some sort of border
    }

    // Drag and Drop Source
    // NB: The ActiveId test is merely an optional micro-optimization, BeginDragDropSource() does the same test.
    if (g.ActiveId == id && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropSource())
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F, &col_rgb, sizeof(float) * 3, ImGuiCond_Once);
        else
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F, &col_rgb, sizeof(float) * 4, ImGuiCond_Once);
        ColorButton(desc_id, col, flags);
        SameLine();
        TextEx("Color");
        EndDragDropSource();
    }

    // Tooltip
    if (!(flags & ImGuiColorEditFlags_NoTooltip) && hovered)
        ColorTooltip(desc_id, &col.x, flags & (ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf));

    return pressed;
}